

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O2

void __thiscall Fifteen::slotGenerateBoard(Fifteen *this)

{
  bool bVar1;
  BoardSize boardSize;
  Result RVar2;
  QString *pQVar3;
  QArrayDataPointer<char16_t> QStack_28;
  
  boardSize = Panel::checkBoardSize
                        ((this->panel)._M_t.
                         super___uniq_ptr_impl<Panel,_std::default_delete<Panel>_>._M_t.
                         super__Tuple_impl<0UL,_Panel_*,_std::default_delete<Panel>_>.
                         super__Head_base<0UL,_Panel_*,_false>._M_head_impl);
  bVar1 = Panel::checkBoardMode
                    ((this->panel)._M_t.super___uniq_ptr_impl<Panel,_std::default_delete<Panel>_>.
                     _M_t.super__Tuple_impl<0UL,_Panel_*,_std::default_delete<Panel>_>.
                     super__Head_base<0UL,_Panel_*,_false>._M_head_impl,GRAPHIC);
  RVar2 = Controller::generateBoard
                    ((this->controller)._M_t.
                     super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
                     super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
                     super__Head_base<0UL,_Controller_*,_false>._M_head_impl,boardSize,(uint)bVar1);
  if (RVar2 != OK) {
    QString::QString((QString *)&QStack_28,"");
    pQVar3 = Message::getMessage(OK);
    QMessageBox::information(this,&QStack_28,pQVar3,0x400,0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_28);
    return;
  }
  redrawTiles(this);
  return;
}

Assistant:

void Fifteen::slotGenerateBoard()
{
    BoardSize boardSize = panel->checkBoardSize();
    BoardMode boardMode = panel->checkBoardMode( BoardMode::GRAPHIC ) ? BoardMode::GRAPHIC : BoardMode::NUMERIC;

    if ( Result result = controller->generateBoard( boardSize, boardMode ); result != Result::OK )
    {
        QMessageBox::information( this, "", Message::getMessage( result ));
        return;
    }
    redrawTiles();
}